

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O2

void __thiscall
QTemporaryFileName::QTemporaryFileName(QTemporaryFileName *this,QString *templateName)

{
  QChar *pQVar1;
  char *pcVar2;
  undefined1 *puVar3;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QLatin1StringView str;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QFileSystemEntry local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->path).d.d = (Data *)0x0;
  (this->path).d.ptr = (char *)0x0;
  (this->path).d.size = 0;
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QDir::fromNativeSeparators((QString *)&local_88,templateName);
  puVar3 = (undefined1 *)local_88.size;
  do {
    lVar4 = 0;
    while( true ) {
      bVar5 = puVar3 == (undefined1 *)0x0;
      puVar3 = puVar3 + -1;
      if (bVar5) {
        if (5 < lVar4) goto LAB_0023d302;
        goto LAB_0023d2ee;
      }
      pQVar1 = QString::data((QString *)&local_88);
      if (pQVar1[(long)puVar3].ucs != L'X') break;
      lVar4 = lVar4 + 1;
    }
    if (5 < lVar4) goto LAB_0023d302;
    pQVar1 = QString::data((QString *)&local_88);
  } while (pQVar1[(long)puVar3].ucs != L'/');
LAB_0023d2ee:
  str.m_data = ".XXXXXX";
  str.m_size = 7;
  QString::append((QString *)&local_88,str);
LAB_0023d302:
  local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QDir::cleanPath((QString *)&local_c0,(QString *)&local_88);
  QFileSystemEntry::QFileSystemEntry(&local_68,(QString *)&local_c0);
  QFileSystemEntry::nativeFilePath((NativePath *)&local_a8,&local_68);
  QFileSystemEntry::~QFileSystemEntry(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
  lVar4 = 0;
  puVar3 = (undefined1 *)local_a8.size;
  while (puVar3 != (undefined1 *)0x0) {
    pcVar2 = QByteArray::data((QByteArray *)&local_a8);
    if (pcVar2[(long)(puVar3 + -1)] == 'X') {
      lVar4 = lVar4 + 1;
      puVar3 = puVar3 + -1;
    }
    else {
      if (5 < lVar4) break;
      lVar4 = 0;
      puVar3 = puVar3 + -1;
    }
  }
  QByteArray::operator=(&this->path,(QByteArray *)&local_a8);
  this->pos = (qsizetype)puVar3;
  this->length = lVar4;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QTemporaryFileName::QTemporaryFileName(const QString &templateName)
{
    // Ensure there is a placeholder mask
    QString qfilename = QDir::fromNativeSeparators(templateName);
    qsizetype phPos = qfilename.size();
    qsizetype phLength = 0;

    while (phPos != 0) {
        --phPos;

        if (qfilename[phPos] == u'X') {
            ++phLength;
            continue;
        }

        if (phLength >= 6
                || qfilename[phPos] == u'/') {
            ++phPos;
            break;
        }

        // start over
        phLength = 0;
    }

    if (phLength < 6)
        qfilename.append(".XXXXXX"_L1);

    // "Nativify" :-)
    QFileSystemEntry::NativePath filename =
            QFileSystemEntry(QDir::cleanPath(qfilename)).nativeFilePath();

    // Find mask in native path
    phPos = filename.size();
    phLength = 0;
    while (phPos != 0) {
        --phPos;

        if (filename[phPos] == Latin1Char('X')) {
            ++phLength;
            continue;
        }

        if (phLength >= 6) {
            ++phPos;
            break;
        }

        // start over
        phLength = 0;
    }

    Q_ASSERT(phLength >= 6);
    path = filename;
    pos = phPos;
    length = phLength;
}